

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void * asio::detail::thread_info_base::
       allocate<asio::detail::thread_info_base::cancellation_signal_tag>
                 (long param_1,long param_2,ulong param_3)

{
  byte *pbVar1;
  ulong align;
  void *pvVar2;
  uchar *mem;
  void *pointer;
  void *pointer_2;
  int mem_index_1;
  uchar *mem_1;
  void *pointer_1;
  int mem_index;
  size_t chunks;
  undefined1 local_6c;
  int local_4c;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  align = param_2 + 3U >> 2;
  if (param_1 != 0) {
    for (in_stack_ffffffffffffffcc = 6; in_stack_ffffffffffffffcc < 8;
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
      if (((*(long *)(param_1 + (long)in_stack_ffffffffffffffcc * 8) != 0) &&
          (pbVar1 = *(byte **)(param_1 + (long)in_stack_ffffffffffffffcc * 8), align <= *pbVar1)) &&
         ((ulong)pbVar1 % param_3 == 0)) {
        *(undefined8 *)(param_1 + (long)in_stack_ffffffffffffffcc * 8) = 0;
        pbVar1[param_2] = *pbVar1;
        return pbVar1;
      }
    }
    for (local_4c = 6; local_4c < 8; local_4c = local_4c + 1) {
      if (*(long *)(param_1 + (long)local_4c * 8) != 0) {
        *(undefined8 *)(param_1 + (long)local_4c * 8) = 0;
        aligned_delete((void *)0x16a291);
        break;
      }
    }
  }
  pvVar2 = aligned_new(align,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (align < 0x100) {
    local_6c = (undefined1)align;
  }
  else {
    local_6c = 0;
  }
  *(undefined1 *)((long)pvVar2 + param_2) = local_6c;
  return pvVar2;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }